

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

bool __thiscall wabt::WastLexer::ReadNum(WastLexer *this)

{
  bool bVar1;
  bool bVar2;
  byte *pbVar3;
  uint c;
  uint c_00;
  
LAB_0016c553:
  do {
    c = 0xffffffff;
    c_00 = c;
    if (this->cursor_ < this->buffer_end_) {
      c_00 = (uint)(byte)*this->cursor_;
    }
    bVar1 = IsDigit(c_00);
    if (!bVar1) {
      return bVar1;
    }
    pbVar3 = (byte *)this->cursor_;
    if (pbVar3 < this->buffer_end_) {
      pbVar3 = pbVar3 + 1;
      this->cursor_ = (char *)pbVar3;
    }
    if (pbVar3 < this->buffer_end_) {
      if (*pbVar3 == 0x5f) {
        this->cursor_ = (char *)(pbVar3 + 1);
        goto LAB_0016c553;
      }
      c = (uint)*pbVar3;
    }
    bVar2 = IsDigit(c);
    if (!bVar2) {
      return bVar1;
    }
  } while( true );
}

Assistant:

bool WastLexer::ReadNum() {
  if (IsDigit(PeekChar())) {
    ReadChar();
    return MatchChar('_') || IsDigit(PeekChar()) ? ReadNum() : true;
  }
  return false;
}